

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_move_grow.cpp
# Opt level: O0

bool Am_Check_And_Fix_Object_Group(Am_Object *obj,Am_Object *inter,Am_Object *new_owner)

{
  bool bVar1;
  int x_00;
  uint y_00;
  Am_Value *pAVar2;
  bool local_12f;
  bool local_12a;
  Am_Object local_d8;
  Am_Object local_d0;
  Am_Object local_c8;
  byte local_b9;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Object temp;
  Am_Object curr_owner;
  Am_Object event_window;
  int y;
  int x;
  Am_Object old_owner;
  Am_Object owner;
  undefined1 local_68 [8];
  Am_Value v;
  Am_Value_List owner_list;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object *local_28;
  Am_Object *new_owner_local;
  Am_Object *inter_local;
  Am_Object *obj_local;
  
  local_28 = new_owner;
  new_owner_local = inter;
  inter_local = obj;
  Am_Object::operator=(new_owner,&Am_No_Object);
  Am_Object::Get_Owner(&local_30,(Am_Slot_Flags)inter_local);
  Am_Object::Am_Object(&local_38,&Am_Screen);
  bVar1 = Am_Object::Is_Instance_Of(&local_30,&local_38);
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&local_30);
  if (bVar1) {
    obj_local._7_1_ = 1;
    goto LAB_0023a9f9;
  }
  Am_Value_List::Am_Value_List((Am_Value_List *)&v.value);
  Am_Value::Am_Value((Am_Value *)local_68);
  pAVar2 = Am_Object::Peek(new_owner_local,0x116,0);
  Am_Value::operator=((Am_Value *)local_68,pAVar2);
  bVar1 = Am_Value_List::Test((Am_Value *)local_68);
  if (bVar1) {
    Am_Value_List::operator=((Am_Value_List *)&v.value,(Am_Value *)local_68);
    Am_Object::Am_Object(&old_owner);
    Am_Object::Am_Object((Am_Object *)&y);
    pAVar2 = Am_Object::Get(new_owner_local,0x121,0);
    x_00 = Am_Value::operator_cast_to_int(pAVar2);
    pAVar2 = Am_Object::Get(new_owner_local,0x122,0);
    y_00 = Am_Value::operator_cast_to_int(pAVar2);
    pAVar2 = Am_Object::Get(new_owner_local,0x68,0);
    Am_Object::Am_Object(&curr_owner,pAVar2);
    Am_Object::Am_Object(&temp);
    Am_Object::Am_Object(&local_a0);
    Am_Value_List::Start((Am_Value_List *)&v.value);
    while (bVar1 = Am_Value_List::Last((Am_Value_List *)&v.value), ((bVar1 ^ 0xffU) & 1) != 0) {
      pAVar2 = Am_Value_List::Get((Am_Value_List *)&v.value);
      Am_Object::operator=(&temp,pAVar2);
      Am_Object::Am_Object(&local_a8,&curr_owner);
      bVar1 = Am_Object::Is_Part_Of(&temp,&local_a8);
      local_12a = false;
      if (bVar1) {
        local_12a = Am_Point_In_All_Owners(&temp,x_00,y_00,&curr_owner);
      }
      Am_Object::~Am_Object(&local_a8);
      if (local_12a != false) {
        Am_Point_In_Obj(&local_b0,(int)&temp,x_00,(Am_Object *)(ulong)y_00);
        Am_Object::operator=(&local_a0,&local_b0);
        Am_Object::~Am_Object(&local_b0);
        bVar1 = Am_Object::Valid(&local_a0);
        if (bVar1) {
          local_b9 = 0;
          bVar1 = Am_Object::Valid(&old_owner);
          local_12f = true;
          if (bVar1) {
            Am_Object::Am_Object(&local_b8,&old_owner);
            local_b9 = 1;
            local_12f = Am_Object::Is_Part_Of(&temp,&local_b8);
          }
          if ((local_b9 & 1) != 0) {
            Am_Object::~Am_Object(&local_b8);
          }
          if (local_12f != false) {
            Am_Object::operator=(&old_owner,&temp);
          }
        }
      }
      Am_Value_List::Next((Am_Value_List *)&v.value);
    }
    bVar1 = Am_Object::Valid(&old_owner);
    if (bVar1) {
      Am_Object::operator=(local_28,&old_owner);
      Am_Object::Get_Owner(&local_c8,(Am_Slot_Flags)inter_local);
      Am_Object::operator=((Am_Object *)&y,&local_c8);
      Am_Object::~Am_Object(&local_c8);
      bVar1 = Am_Object::operator!=(&old_owner,(Am_Object *)&y);
      if (bVar1) {
        Am_Object::Am_Object(&local_d0,inter_local);
        bVar1 = Am_Object::Is_Part_Of(&old_owner,&local_d0);
        Am_Object::~Am_Object(&local_d0);
        if (bVar1) {
          obj_local._7_1_ = 0;
          goto LAB_0023a961;
        }
        Am_Object::Remove_From_Owner(inter_local);
        Am_Object::Am_Object(&local_d8,inter_local);
        Am_Object::Add_Part(&old_owner,&local_d8,true,0);
        Am_Object::~Am_Object(&local_d8);
      }
      obj_local._7_1_ = 1;
    }
    else {
      obj_local._7_1_ = 0;
    }
LAB_0023a961:
    Am_Object::~Am_Object(&local_a0);
    Am_Object::~Am_Object(&temp);
    Am_Object::~Am_Object(&curr_owner);
    Am_Object::~Am_Object((Am_Object *)&y);
    Am_Object::~Am_Object(&old_owner);
  }
  else {
    obj_local._7_1_ = 1;
  }
  Am_Value::~Am_Value((Am_Value *)local_68);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&v.value);
LAB_0023a9f9:
  return (bool)(obj_local._7_1_ & 1);
}

Assistant:

bool
Am_Check_And_Fix_Object_Group(Am_Object &obj, const Am_Object &inter,
                              Am_Object &new_owner)
{
  new_owner = Am_No_Object;
  // if we are moving a top-level window, don't need to do anything
  if (obj.Get_Owner().Is_Instance_Of(Am_Screen))
    return true;

  Am_Value_List owner_list;
  Am_Value v;
  v = inter.Peek(Am_MULTI_OWNERS);
  if (Am_Value_List::Test(v))
    owner_list = v;
  else
    return true; //otherwise, leave in original window

  Am_Object owner, old_owner;
  int x = inter.Get(Am_INTERIM_X);
  int y = inter.Get(Am_INTERIM_Y);
  Am_Object event_window = inter.Get(Am_WINDOW);

  Am_Object curr_owner, temp;
  for (owner_list.Start(); !owner_list.Last(); owner_list.Next()) {
    curr_owner = owner_list.Get();
    if (curr_owner.Is_Part_Of(event_window) &&
        Am_Point_In_All_Owners(curr_owner, x, y, event_window)) {
      temp = Am_Point_In_Obj(curr_owner, x, y, event_window);
      if (temp.Valid()) {
        if (!owner.Valid() || curr_owner.Is_Part_Of(owner))
          owner = curr_owner;
      }
    }
  }
  if (!owner.Valid())
    return false;
  new_owner = owner;
  old_owner = obj.Get_Owner();
  if (owner != old_owner) {
    if (owner.Is_Part_Of(obj))
      return false;
    Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SETTING,
                         "Inter " << inter << " moving object " << obj
                                  << " to new owner " << owner
                                  << " because mouse moved from prev owner "
                                  << old_owner);
    obj.Remove_From_Owner(); // make the object no longer be a part of its old
                             // place
    owner.Add_Part(obj);
  }
  return true;
}